

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.c
# Opt level: O1

void complete_cmd(char *buf,char *hint,linenoiseCompletions *lc)

{
  uint uVar1;
  linenoiseCompletions *lc_00;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  COMMAND *pCVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  char *pcVar9;
  char *__s2;
  uint match_count;
  char opt [3];
  char **matches;
  uint local_60;
  char local_5c [4];
  char **local_58;
  char *local_50;
  linenoiseCompletions *local_48;
  char *local_40;
  undefined4 *local_38;
  
  local_5c[2] = 0;
  local_5c[0] = '\0';
  local_5c[1] = ':';
  local_58 = (char **)0x0;
  local_60 = 0;
  local_50 = hint;
  local_48 = lc;
  if (buf == hint) {
    local_60 = 0;
    local_58 = (char **)0x0;
    if (commands[0].name != (char *)0x0) {
      pCVar5 = commands;
      pcVar9 = commands[0].name;
      do {
        pCVar5 = pCVar5 + 1;
        sVar3 = strlen(hint);
        iVar2 = strncmp(hint,pcVar9,sVar3);
        if (iVar2 == 0) {
          cmd_completion_add_match(pcVar9,&local_58,&local_60);
        }
        pcVar9 = pCVar5->name;
      } while (pcVar9 != (char *)0x0);
    }
LAB_00109d80:
    lc_00 = local_48;
    if (local_60 != 0) {
      uVar6 = 0;
      do {
        linenoiseAddCompletion(lc_00,local_58[uVar6]);
        free(local_58[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_60);
    }
    free(local_58);
    return;
  }
  local_40 = hint + -1;
  lVar8 = 0;
LAB_00109c01:
  uVar1 = (&DAT_0011da40)[lVar8 * 6];
  pcVar9 = commands[uVar1].name;
  sVar3 = strlen(pcVar9);
  iVar2 = strncmp(buf,pcVar9,sVar3);
  if ((iVar2 == 0) && (pcVar9 = local_40, pcVar4 = local_50, buf[sVar3] == ' ')) {
    while (__s2 = buf, buf != pcVar4) {
      if (*pcVar9 != ' ') goto LAB_00109c6b;
      pcVar9 = pcVar9 + -1;
      pcVar4 = pcVar9;
    }
    goto LAB_00109c7d;
  }
  goto LAB_00109d0a;
  while (pcVar9 = pcVar9 + -1, __s2 = buf, pcVar9 != buf) {
LAB_00109c6b:
    __s2 = pcVar9;
    if (pcVar9[-1] == ' ') break;
  }
LAB_00109c7d:
  if (*__s2 == '-') {
    cVar7 = __s2[1];
  }
  else {
    cVar7 = '\0';
  }
  local_38 = &DAT_0011da40 + lVar8 * 6;
  local_5c[0] = cVar7;
  pcVar9 = (char *)(&DAT_0011da48)[lVar8 * 3];
  if (((cVar7 == '\0') || (pcVar9 != (char *)0x0)) ||
     (pcVar4 = strstr(commands[uVar1].optstring,local_5c), pcVar4 == (char *)0x0)) {
    if ((cVar7 == '\0') || (pcVar9 == (char *)0x0)) {
      if ((cVar7 != '\0') || (pcVar9 == (char *)0x0)) goto LAB_00109dd2;
    }
    else {
      sVar3 = strlen(pcVar9);
      iVar2 = strncmp(pcVar9,__s2,sVar3);
      if ((cVar7 != '\0') && (iVar2 == 0)) {
LAB_00109dd2:
        if (*(code **)(local_38 + 4) == (code *)0x0) {
          path_completion(local_50,local_48);
        }
        else {
          (**(code **)(local_38 + 4))(local_50,&local_58,&local_60);
        }
        goto LAB_00109d80;
      }
    }
  }
LAB_00109d0a:
  lVar8 = lVar8 + 1;
  if (lVar8 == 0x14) goto LAB_00109d80;
  goto LAB_00109c01;
}

Assistant:

void
complete_cmd(const char *buf, const char *hint, linenoiseCompletions *lc)
{
    struct autocomplete {
        enum COMMAND_INDEX ci;      /**< command index to global variable 'commands' */
        const char *opt;            /**< optional option */
        void (*yl_cb)(const char *, char ***, unsigned int *);  /**< yanglint callback to call */
    } ac[] = {
        {CMD_ADD,         NULL,    NULL},
        {CMD_PRINT,       "-f",    get_print_format_arg},
        {CMD_PRINT,       "-P",    get_schema_completion},
        {CMD_PRINT,       "-o",    NULL},
        {CMD_PRINT,       NULL,    get_model_completion},
        {CMD_SEARCHPATH,  NULL,    NULL},
        {CMD_EXTDATA,     NULL,    NULL},
        {CMD_CLEAR,       "-Y",    NULL},
        {CMD_DATA,        "-t",    get_data_type_arg},
        {CMD_DATA,        "-O",    NULL},
        {CMD_DATA,        "-R",    NULL},
        {CMD_DATA,        "-f",    get_data_in_format_arg},
        {CMD_DATA,        "-F",    get_data_in_format_arg},
        {CMD_DATA,        "-d",    get_data_default_arg},
        {CMD_DATA,        "-o",    NULL},
        {CMD_DATA,        NULL,    NULL},
        {CMD_LIST,        NULL,    get_list_format_arg},
        {CMD_FEATURE,     NULL,    get_model_completion},
        {CMD_VERB,        NULL,    get_verb_arg},
        {CMD_DEBUG,       NULL,    get_debug_arg},
    };
    size_t name_len;
    const char *last, *name, *getoptstr;
    char opt[3] = {'\0', ':', '\0'};
    char **matches = NULL;
    unsigned int match_count = 0, i;

    if (buf == hint) {
        /* command autocomplete */
        get_cmd_completion(hint, &matches, &match_count);

    } else {
        for (i = 0; i < (sizeof ac / sizeof *ac); ++i) {
            /* Find the right command. */
            name = commands[ac[i].ci].name;
            name_len = strlen(name);
            if (strncmp(buf, name, name_len) || (buf[name_len] != ' ')) {
                /* not this command */
                continue;
            }

            /* Select based on the right option. */
            last = get_last_str(buf, hint);
            opt[0] = (last[0] == '-') && last[1] ? last[1] : '\0';
            getoptstr = commands[ac[i].ci].optstring;
            if (!ac[i].opt && opt[0] && strstr(getoptstr, opt)) {
                /* completion for the argument must be defined */
                continue;
            } else if (ac[i].opt && opt[0] && strncmp(ac[i].opt, last, strlen(ac[i].opt))) {
                /* completion for (another) option */
                continue;
            } else if (ac[i].opt && !opt[0]) {
                /* completion is defined for option */
                continue;
            }

            /* callback */
            if (ac[i].yl_cb) {
                ac[i].yl_cb(hint, &matches, &match_count);
            } else {
                path_completion(hint, lc);
            }
            break;
        }
    }

    /* transform matches into autocompletion, if needed */
    for (i = 0; i < match_count; ++i) {
        linenoiseAddCompletion(lc, matches[i]);
        free(matches[i]);
    }
    free(matches);
}